

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void * ma_calloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  
  pvVar1 = ma_malloc(sz,pAllocationCallbacks);
  if (sz != 0 && pvVar1 != (void *)0x0) {
    pvVar1 = memset(pvVar1,0,sz);
    return pvVar1;
  }
  return pvVar1;
}

Assistant:

MA_API void* ma_calloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    void* p = ma_malloc(sz, pAllocationCallbacks);
    if (p != NULL) {
        MA_ZERO_MEMORY(p, sz);
    }

    return p;
}